

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  streambuf *psVar1;
  string local_3f0;
  undefined1 local_3d0 [8];
  string text;
  stringstream strStream;
  ostream local_3a0 [392];
  char local_218 [8];
  ifstream inFile;
  
  std::ifstream::ifstream(local_218);
  std::ifstream::open(local_218,0x138190);
  std::__cxx11::stringstream::stringstream((stringstream *)(text.field_2._M_local_buf + 8));
  psVar1 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_3a0,psVar1);
  std::__cxx11::stringstream::str();
  compile(&local_3f0,(string *)local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)local_3d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)(text.field_2._M_local_buf + 8));
  std::ifstream::~ifstream(local_218);
  return 0;
}

Assistant:

int main() {
    ifstream inFile;
    inFile.open("yourinputfiledirectory");
    stringstream strStream;
    strStream << inFile.rdbuf();
    string text = strStream.str();
    compile(text);
    return 0;
}